

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false>>>
::
Intrusive_list_column<std::map<unsigned_int,unsigned_int,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false>>>
           *this,map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 *nonZeroRowIndices,Dimension dimension,Column_settings *colSettings)

{
  node_ptr plVar1;
  node_ptr plVar2;
  undefined4 uVar3;
  undefined8 in_RAX;
  long lVar4;
  pointer pEVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  _Rb_tree_header *p_Var8;
  undefined8 uStack_38;
  
  *(Dimension *)this = dimension;
  p_Var6 = (nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(nonZeroRowIndices->_M_t)._M_impl.super__Rb_tree_header;
  uStack_38 = in_RAX;
  if ((_Rb_tree_header *)p_Var6 == p_Var8) {
    uVar3 = 0xffffffff;
  }
  else {
    lVar4 = std::_Rb_tree_decrement(&p_Var8->_M_header);
    uVar3 = *(undefined4 *)(lVar4 + 0x20);
  }
  plVar1 = (node_ptr)(this + 0x20);
  *(undefined4 *)(this + 4) = uVar3;
  *(undefined4 *)(this + 8) = 0xffffffff;
  *(Entry_constructor **)(this + 0x18) = &colSettings->entryConstructor;
  *(node_ptr *)(this + 0x20) = plVar1;
  *(node_ptr *)(this + 0x28) = plVar1;
  *(Column_settings **)(this + 0x10) = colSettings;
  if ((_Rb_tree_header *)p_Var6 != p_Var8) {
    do {
      uVar7 = *(uint *)&p_Var6[1].field_0x4;
      if (**(uint **)(this + 0x10) <= uVar7) {
        uVar7 = uVar7 % **(uint **)(this + 0x10);
      }
      uStack_38 = CONCAT44(p_Var6[1]._M_color,(undefined4)uStack_38);
      pEVar5 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false>>>>
               ::construct<unsigned_int&>
                         (*(Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,false,false>>>>
                            **)(this + 0x18),(uint *)((long)&uStack_38 + 4));
      (pEVar5->super_Entry_field_element_option).element_ = uVar7;
      if ((pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                      "/usr/include/boost/intrusive/list.hpp",0x33c,
                      "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, false, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, false, false>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, false, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Chain_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, false, false, false>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                     );
      }
      plVar2 = *(node_ptr *)(this + 0x28);
      (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = plVar2;
      (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = plVar1;
      *(Column_hook **)(this + 0x28) = &pEVar5->super_Column_hook;
      plVar2->next_ = (node_ptr)&pEVar5->super_Column_hook;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var8);
  }
  return;
}

Assistant:

inline Intrusive_list_column<Master_matrix>::Intrusive_list_column(const Container& nonZeroRowIndices,
                                                                   Dimension dimension,
                                                                   Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(dimension),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor)),
      column_()
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}